

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O1

void __thiscall CEObserver::UpdatePosVel(CEObserver *this,CEDate *date)

{
  double dVar1;
  reference pvVar2;
  int i;
  size_type __n;
  double extraout_XMM0_Qa;
  undefined8 uVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double tdb2;
  double tdb1;
  double tt2;
  double tt1;
  double ut11;
  double pvc [2] [3];
  double ut12;
  double ebpv [2] [3];
  double ehpv [2] [3];
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8 [7];
  double local_a0;
  double local_98 [6];
  undefined1 local_68 [56];
  
  (*date->_vptr_CEDate[5])(date);
  if ((extraout_XMM0_Qa != this->cache_date_) || (NAN(extraout_XMM0_Qa) || NAN(this->cache_date_)))
  {
    __n = 0;
    local_e0 = 0.0;
    local_a0 = 0.0;
    local_118 = 0.0;
    local_120 = 0.0;
    local_e8 = 0.0;
    local_f0 = 0.0;
    (*date->_vptr_CEDate[5])(date);
    CEDate::UTC2UT1(local_d8,&local_e0,&local_a0);
    (*date->_vptr_CEDate[5])(date);
    CEDate::UTC2TDB(local_d8,&local_118,&local_120);
    (*date->_vptr_CEDate[5])(date);
    CEDate::UTC2TT(local_d8,&local_e8,&local_f0);
    uVar3 = iauEra00(local_e0,local_a0);
    uVar4 = iauSp00(local_e8,local_f0);
    local_f8 = this->longitude_;
    local_100 = this->latitude_;
    local_108 = this->elevation_m_;
    local_110 = CEDate::xpolar(date);
    dVar5 = CEDate::ypolar(date);
    iauPvtob(local_f8,local_100,local_108,local_110,SUB84(dVar5,0),uVar4,uVar3,local_d8);
    iauEpv00(local_118,local_120,local_68,local_98);
    dVar5 = CppEphem::sec_per_day();
    dVar6 = CppEphem::m_per_au();
    do {
      dVar1 = local_d8[__n];
      dVar7 = CppEphem::m_per_au();
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->pos_cirs_,__n);
      *pvVar2 = dVar1 / dVar7;
      dVar1 = local_d8[__n + 3];
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->vel_cirs_,__n);
      *pvVar2 = dVar1 * (dVar5 / dVar6);
      dVar1 = local_98[__n];
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->pos_cirs_,__n);
      dVar7 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->pos_icrs_,__n);
      *pvVar2 = dVar1 + dVar7;
      dVar1 = local_98[__n + 3];
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->vel_cirs_,__n);
      dVar7 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->vel_icrs_,__n);
      *pvVar2 = dVar1 + dVar7;
      __n = __n + 1;
    } while (__n != 3);
  }
  return;
}

Assistant:

void CEObserver::UpdatePosVel(const CEDate& date) const
{
    // Check if the cached date has changed
    if (date.MJD() != cache_date_) {

        // Convert UTC to UT1 and TDB
        double ut11(0.0);
        double ut12(0.0);
        double tdb1(0.0);
        double tdb2(0.0);
        double tt1(0.0);
        double tt2(0.0);
        CEDate::UTC2UT1(date.MJD(), &ut11, &ut12);
        CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
        CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

        // Compute the Earth rotation angle at UT1
        double theta = iauEra00(ut11, ut12);
        double sp    = iauSp00(tt1, tt2);

        // Vectors for intermediate position/velocities
        double pvc[2][3];   // CIRS pos,vel

        // Get the position and velocity values in CIRS
        iauPvtob(longitude_, 
                 latitude_, 
                 elevation_m_, 
                 date.xpolar(),
                 date.ypolar(),
                 sp,
                 theta,
                 pvc);

        // Earth centric distance/velocity in ICRS (AU and AU/day)
        double ebpv[2][3];
        double ehpv[2][3];
        iauEpv00(tdb1, tdb2, ehpv, ebpv);

        // Get the CIRS and ICRS pos,vel
        double mps_apd = CppEphem::sec_per_day() / CppEphem::m_per_au();
        for (int i=0; i<3; i++) {
            // CIRS
            pos_cirs_[i] = pvc[0][i] / CppEphem::m_per_au();
            vel_cirs_[i] = pvc[1][i] * mps_apd;

            // ICRS (Earth barycenter + CIRS offset)
            pos_icrs_[i] = ebpv[0][i] + pos_cirs_[i];
            vel_icrs_[i] = ebpv[1][i] + vel_cirs_[i];
        }
    }
    return;
}